

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformprintdevice.cpp
# Opt level: O0

void __thiscall QPlatformPrintDevice::~QPlatformPrintDevice(QPlatformPrintDevice *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__QPlatformPrintDevice_001a84c8;
  QList<QMimeType>::~QList((QList<QMimeType> *)0x1316f1);
  QList<QPrint::ColorMode>::~QList((QList<QPrint::ColorMode> *)0x131702);
  QList<QPrint::DuplexMode>::~QList((QList<QPrint::DuplexMode> *)0x131713);
  QList<QPrint::OutputBin>::~QList((QList<QPrint::OutputBin> *)0x131724);
  QList<QPrint::InputSlot>::~QList((QList<QPrint::InputSlot> *)0x131735);
  QList<int>::~QList((QList<int> *)0x131746);
  QList<QPageSize>::~QList((QList<QPageSize> *)0x131754);
  QString::~QString((QString *)0x131762);
  QString::~QString((QString *)0x131770);
  QString::~QString((QString *)0x13177e);
  QString::~QString((QString *)0x13178c);
  return;
}

Assistant:

QPlatformPrintDevice::~QPlatformPrintDevice()
{
}